

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O2

void __thiscall tst_helpers_reduce::emptySequence(tst_helpers_reduce *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  bool bVar3;
  char cVar4;
  PromiseData<int> *this_00;
  PromiseResolver<int> *pPVar5;
  int *value;
  QPromiseReject<int> *in_R8;
  int iVar6;
  bool called;
  PromiseResolver<int> resolver;
  Type p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_168;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_160;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_158;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_150;
  QPromiseBase<int> local_148;
  QPromiseBase<int> local_138;
  anon_class_64_3_a63a5800 local_128;
  anon_class_48_4_6432c65f local_e8;
  QArrayDataPointer<int> local_b8;
  int *local_a0;
  long local_98;
  Type input;
  int local_7c;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_50;
  
  called = false;
  local_b8.size = 0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (int *)0x0;
  local_7c = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&p,&local_7c);
  iVar6 = 0;
  value = local_b8.ptr;
  for (local_98 = local_b8.size << 2; local_98 != 0; local_98 = local_98 + -4) {
    local_a0 = value;
    QtPromise::resolve<int_const&>((QtPromise *)&input,value);
    local_e8.input.super_QPromiseBase<int>.m_d.d = input.super_QPromiseBase<int>.m_d.d;
    if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e8.input.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_e8.fn.called = &called;
    local_e8.promise.super_QPromiseBase<int>.m_d.d = p.super_QPromiseBase<int>.m_d.d;
    if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e8.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_148._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001348c0;
    local_e8.idx = iVar6;
    this_00 = (PromiseData<int> *)operator_new(0x68);
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(this_00);
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (this_00 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_138._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    local_148.m_d.d = this_00;
    local_138.m_d.d = this_00;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_138);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&local_138);
    QVar2 = p.super_QPromiseBase<int>.m_d;
    if (resolver.m_d.d == (Data *)0x0) {
      local_150.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      local_150 = resolver.m_d.d;
    }
    local_158.d = (Data *)0x0;
    if (local_150.d == (Data *)0x0) {
      local_160.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_160.d = local_150.d;
    }
    local_168.d = (Data *)0x0;
    if (local_150.d != (Data *)0x0) {
      LOCK();
      ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_160.d != (Data *)0x0) {
      LOCK();
      ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_128.handler.input.super_QPromiseBase<int>.m_d.d =
         local_e8.input.super_QPromiseBase<int>.m_d.d;
    if (local_e8.input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_e8.input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_128.handler.input.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_128.handler.fn.v1 = (QVector<int> *)local_e8.fn.called;
    local_128.handler.promise.super_QPromiseBase<int>.m_d.d =
         local_e8.promise.super_QPromiseBase<int>.m_d.d;
    if (local_e8.promise.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_e8.promise.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_128.handler.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_128.handler.idx = local_e8.idx;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_128.resolve.m_resolver.m_d.d = (PromiseResolver<int>)(PromiseResolver<int>)local_150.d;
    local_128.reject.m_resolver.m_d.d = (PromiseResolver<int>)(PromiseResolver<int>)local_160.d;
    pPVar5 = (PromiseResolver<int> *)operator_new(0x40);
    pPVar5->m_d = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
                  local_128.resolve.m_resolver.m_d.d;
    if (local_128.resolve.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      *(int *)local_128.resolve.m_resolver.m_d.d =
           (int)*(QAtomicInt *)local_128.resolve.m_resolver.m_d.d + 1;
      UNLOCK();
    }
    pPVar5[1].m_d.d = (Data *)local_128.reject.m_resolver.m_d.d;
    if (local_128.reject.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      *(int *)local_128.reject.m_resolver.m_d.d =
           (int)*(QAtomicInt *)local_128.reject.m_resolver.m_d.d + 1;
      UNLOCK();
    }
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    _lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_234_32_
              ((anon_class_48_4_6432c65f *)(pPVar5 + 2),
               (anon_class_48_4_6432c65f *)&local_128.handler);
    pcStack_60 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    local_78._M_unused._0_8_ = (undefined8)pPVar5;
    anon_func::anon_class_64_3_a63a5800::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromise_p_h_270_16_
              (&local_128);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&local_78);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    QVar2 = p.super_QPromiseBase<int>.m_d;
    QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              (&local_50,(PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_150,
               (QPromiseResolve<int> *)&local_160,in_R8);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_160);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_168);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_150);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_158);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver.m_d);
    local_148._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
      ;
    }
    QtPromise::QPromiseBase<int>::operator=(&p.super_QPromiseBase<int>,&local_148);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&local_148);
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_234_32_
              (&local_e8);
    iVar6 = iVar6 + 1;
    QtPromise::QPromiseBase<int>::~QPromiseBase(&input.super_QPromiseBase<int>);
    value = local_a0 + 1;
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_b8);
  local_128.resolve.m_resolver.m_d.d._0_4_ = 0xffffffff;
  iVar6 = waitForValue<int>(&p,(int *)&local_128);
  cVar4 = QTest::qCompare(iVar6,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                          ,0x58);
  if (cVar4 != '\0') {
    local_128.resolve.m_resolver.m_d.d =
         (PromiseResolver<int>)((ulong)local_128.resolve.m_resolver.m_d.d & 0xffffffffffffff00);
    QTest::qCompare<bool,bool>
              (&called,(bool *)&local_128,"called","false",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
               ,0x59);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_helpers_reduce::emptySequence()
{
    bool called = false;

    auto p = QtPromise::reduce(
        QVector<int>{},
        [&](...) {
            called = true;
            return 43;
        },
        42);

    // NOTE(SB): reduce() on an empty sequence without an initial value is an error!

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(called, false);
}